

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void update_theme(natwm_state *state,client *client,uint16_t previous_border_width)

{
  ushort uVar1;
  ushort uVar2;
  theme *theme;
  uint16_t uVar3;
  color_value *pcVar4;
  workspace *workspace;
  monitor *monitor;
  xcb_rectangle_t xVar5;
  char *fmt;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint32_t client_values [3];
  
  if (client->is_fullscreen == false) {
    theme = state->workspace_list->theme;
    uVar3 = client_get_active_border_width(theme,client);
    pcVar4 = client_get_active_border_color(theme,client);
    xcb_change_window_attributes(state->xcb,client->window,8,&pcVar4->color_value);
    if ((client->state & CLIENT_UNTHEMED) != 0) {
      client->state = client->state & 0xef;
    }
    if (uVar3 != previous_border_width) {
      workspace = workspace_list_find_client_workspace(state->workspace_list,client);
      if (workspace == (workspace *)0x0) {
        fmt = "Failed to find workspace during update_theme";
      }
      else {
        monitor = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
        if (monitor != (monitor *)0x0) {
          xVar5 = monitor_get_offset_rect(monitor);
          uVar1 = (client->rect).width;
          iVar9 = (uint)uVar1 + (uint)uVar3 * 2 + (int)(client->rect).x;
          iVar7 = (uint)(monitor->offsets).left + (xVar5._4_4_ & 0xffff);
          uVar2 = (client->rect).height;
          iVar8 = (uint)uVar2 + (uint)uVar3 * 2 + (int)(client->rect).y;
          iVar6 = (uint)(monitor->offsets).top + (uint)xVar5.height;
          if (iVar7 < iVar9) {
            (client->rect).width = uVar1 + ((short)iVar7 - (short)iVar9);
          }
          if (iVar6 < iVar8) {
            (client->rect).height = uVar2 + ((short)iVar6 - (short)iVar8);
          }
          xcb_configure_window(state->xcb,client->window,0x1c);
          uVar3 = client_get_active_border_width(state->workspace_list->theme,client);
          ewmh_update_window_frame_extents(state,client->window,(uint)uVar3);
          return;
        }
        fmt = "Failed to find monitor during update_theme";
      }
      internal_logger(natwm_logger,LEVEL_WARNING,fmt);
      return;
    }
  }
  return;
}

Assistant:

static void update_theme(const struct natwm_state *state, struct client *client,
                         uint16_t previous_border_width)
{
        if (client->is_fullscreen) {
                // No need to upate theme if client is fullscreen
                return;
        }

        uint16_t current_border_width
                = client_get_active_border_width(state->workspace_list->theme, client);
        const struct color_value *border_color
                = client_get_active_border_color(state->workspace_list->theme, client);

        xcb_change_window_attributes(
                state->xcb, client->window, XCB_CW_BORDER_PIXEL, &border_color->color_value);

        // If this is the first time the client has been themed, we need to
        // update the clients state to remove UNTHEMED
        if (client->state & CLIENT_UNTHEMED) {
                client->state &= (uint8_t)~CLIENT_UNTHEMED;
        }

        if (previous_border_width == current_border_width) {
                return;
        }

        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (workspace == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find workspace during update_theme");

                return;
        }

        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find monitor during update_theme");

                return;
        }

        xcb_rectangle_t monitor_rect = monitor_get_offset_rect(monitor);

        int32_t total_border = (current_border_width * 2);

        int32_t total_client_width = (client->rect.width + client->rect.x + total_border);
        int32_t total_monitor_width = (monitor_rect.width + monitor->offsets.left);

        int32_t total_client_height = (client->rect.height + client->rect.y + total_border);
        int32_t total_monitor_height = (monitor_rect.height + monitor->offsets.top);

        // Check if either the width or the height will not be able to fit on
        // the monitor. If either doesn't correct the width to fit
        if (total_client_width > total_monitor_width) {
                int32_t diff = total_client_width - total_monitor_width;

                client->rect.width = (uint16_t)(client->rect.width - diff);
        }

        if (total_client_height > total_monitor_height) {
                int32_t diff = total_client_height - total_monitor_height;

                client->rect.height = (uint16_t)(client->rect.height - diff);
        }

        // Update the client
        uint16_t client_mask = XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT
                | XCB_CONFIG_WINDOW_BORDER_WIDTH;
        uint32_t client_values[] = {
                client->rect.width,
                client->rect.height,
                current_border_width,
        };

        xcb_configure_window(state->xcb, client->window, client_mask, client_values);

        client_update_hints(state, client, FRAME_EXTENTS);
}